

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void lzma_sha256_update(uint8_t *buf,size_t size,lzma_check_state *check)

{
  ulong uVar1;
  lzma_check_state *local_30;
  size_t copy_size;
  size_t copy_start;
  lzma_check_state *check_local;
  size_t size_local;
  uint8_t *buf_local;
  
  check_local = (lzma_check_state *)size;
  size_local = (size_t)buf;
  while (check_local != (lzma_check_state *)0x0) {
    uVar1 = (check->state).sha256.size & 0x3f;
    local_30 = (lzma_check_state *)(0x40 - uVar1);
    if (check_local < local_30) {
      local_30 = check_local;
    }
    memcpy((void *)((long)&check->buffer + uVar1),(void *)size_local,(size_t)local_30);
    size_local = (long)&local_30->buffer + size_local;
    check_local = (lzma_check_state *)((long)check_local - (long)local_30);
    (check->state).sha256.size = (uint64_t)((local_30->buffer).u8 + (check->state).sha256.size);
    if (((check->state).sha256.size & 0x3f) == 0) {
      process(check);
    }
  }
  return;
}

Assistant:

extern void
lzma_sha256_update(const uint8_t *buf, size_t size, lzma_check_state *check)
{
	// Copy the input data into a properly aligned temporary buffer.
	// This way we can be called with arbitrarily sized buffers
	// (no need to be multiple of 64 bytes), and the code works also
	// on architectures that don't allow unaligned memory access.
	while (size > 0) {
		const size_t copy_start = check->state.sha256.size & 0x3F;
		size_t copy_size = 64 - copy_start;
		if (copy_size > size)
			copy_size = size;

		memcpy(check->buffer.u8 + copy_start, buf, copy_size);

		buf += copy_size;
		size -= copy_size;
		check->state.sha256.size += copy_size;

		if ((check->state.sha256.size & 0x3F) == 0)
			process(check);
	}

	return;
}